

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O0

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  long lVar111;
  long lVar112;
  long lVar113;
  undefined8 *puVar114;
  undefined1 (*pauVar115) [32];
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined1 (*pauVar116) [32];
  long *in_RDI;
  __m256 _k17_1;
  __m256 _k16_1;
  __m256 _k15_1;
  __m256 _k14_1;
  __m256 _k13_1;
  __m256 _k12_1;
  __m256 _k11_1;
  __m256 _k10_1;
  __m256 _r17_1;
  __m256 _r16_1;
  __m256 _r15_1;
  __m256 _r14_1;
  __m256 _r13_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _k07_1;
  __m256 _k06_1;
  __m256 _k05_1;
  __m256 _k04_1;
  __m256 _k03_1;
  __m256 _k02_1;
  __m256 _k01_1;
  __m256 _k00_1;
  __m256 _r07_1;
  __m256 _r06_1;
  __m256 _r05_1;
  __m256 _r04_1;
  __m256 _r03_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum;
  __m256 _k17;
  __m256 _k16;
  __m256 _k15;
  __m256 _k14;
  __m256 _k13;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r17;
  __m256 _r16;
  __m256 _r15;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k07;
  __m256 _k06;
  __m256 _k05;
  __m256 _k04;
  __m256 _k03;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _r07;
  __m256 _r06;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum1;
  __m256 _sum0;
  int j;
  int i_1;
  float *kptr;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  int q;
  __m256 _bias0;
  Mat out0;
  int p;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  int local_48c8;
  int local_48c4;
  undefined4 *local_4870;
  undefined4 *local_4868;
  undefined1 (*local_4818) [32];
  int local_4810;
  int local_4798;
  int local_478c;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  int local_14b4;
  undefined1 (*local_14b0) [32];
  
  lVar111 = in_RDI[7];
  iVar9 = *(int *)((long)in_RSI + 0x2c);
  lVar112 = in_RSI[6];
  lVar113 = in_RSI[7];
  lVar11 = *in_RCX;
  for (local_478c = 0; local_478c < (int)lVar113; local_478c = local_478c + 1) {
    iVar10 = *(int *)((long)in_RSI + 0x34);
    pauVar116 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_478c * in_RSI[2]);
    local_4798 = (int)(((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] * in_RSI[2] +
                        0xfU & 0xfffffffffffffff0) / (ulong)in_RSI[2]);
    if ((int)in_RSI[5] == 4) {
      local_4798 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
    }
    if (lVar11 == 0) {
      auVar12 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0),0x20);
      auVar12 = vinsertps_avx(auVar12,ZEXT416(0),0x30);
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      local_1500 = auVar13._0_8_;
      uStack_14f8 = auVar13._8_8_;
      uStack_14f0 = auVar12._0_8_;
      uStack_14e8 = auVar12._8_8_;
      local_5180 = local_1500;
      uStack_5178 = uStack_14f8;
      uStack_5170 = uStack_14f0;
      uStack_5168 = uStack_14e8;
    }
    else {
      puVar114 = (undefined8 *)(lVar11 + (long)(local_478c << 3) * 4);
      local_5180 = *puVar114;
      uStack_5178 = puVar114[1];
      uStack_5170 = puVar114[2];
      uStack_5168 = puVar114[3];
    }
    auVar14._8_8_ = uStack_5178;
    auVar14._0_8_ = local_5180;
    local_14b0 = pauVar116;
    for (local_14b4 = 0; local_14b4 < local_4798 * iVar10; local_14b4 = local_14b4 + 1) {
      auVar14._16_8_ = uStack_5170;
      auVar14._24_8_ = uStack_5168;
      *local_14b0 = auVar14;
      local_14b0 = local_14b0 + 1;
    }
    for (local_4810 = 0; local_4810 < (int)lVar111; local_4810 = local_4810 + 1) {
      local_4868 = (undefined4 *)(*in_RDI + in_RDI[8] * (long)local_4810 * in_RDI[2]);
      local_4870 = (undefined4 *)
                   ((long)local_4868 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
      pauVar115 = (undefined1 (*) [32])
                  (*in_RDX + in_RDX[8] * (long)local_478c * in_RDX[2] +
                  (long)*(int *)((long)in_RDX + 0x2c) * (long)local_4810 * in_RDX[2]);
      local_4818 = pauVar116;
      for (local_48c4 = 0; local_48c4 < (int)lVar112; local_48c4 = local_48c4 + 1) {
        for (local_48c8 = 0; local_48c8 + 1 < iVar9; local_48c8 = local_48c8 + 2) {
          uVar1 = *local_4868;
          auVar107._4_4_ = uVar1;
          auVar107._0_4_ = uVar1;
          auVar107._12_4_ = uVar1;
          auVar107._8_4_ = uVar1;
          auVar107._20_4_ = uVar1;
          auVar107._16_4_ = uVar1;
          auVar107._28_4_ = uVar1;
          auVar107._24_4_ = uVar1;
          uVar1 = local_4868[1];
          auVar103._4_4_ = uVar1;
          auVar103._0_4_ = uVar1;
          auVar103._12_4_ = uVar1;
          auVar103._8_4_ = uVar1;
          auVar103._20_4_ = uVar1;
          auVar103._16_4_ = uVar1;
          auVar103._28_4_ = uVar1;
          auVar103._24_4_ = uVar1;
          uVar1 = local_4868[2];
          auVar99._4_4_ = uVar1;
          auVar99._0_4_ = uVar1;
          auVar99._12_4_ = uVar1;
          auVar99._8_4_ = uVar1;
          auVar99._20_4_ = uVar1;
          auVar99._16_4_ = uVar1;
          auVar99._28_4_ = uVar1;
          auVar99._24_4_ = uVar1;
          uVar1 = local_4868[3];
          auVar95._4_4_ = uVar1;
          auVar95._0_4_ = uVar1;
          auVar95._12_4_ = uVar1;
          auVar95._8_4_ = uVar1;
          auVar95._20_4_ = uVar1;
          auVar95._16_4_ = uVar1;
          auVar95._28_4_ = uVar1;
          auVar95._24_4_ = uVar1;
          uVar1 = local_4868[4];
          auVar91._4_4_ = uVar1;
          auVar91._0_4_ = uVar1;
          auVar91._12_4_ = uVar1;
          auVar91._8_4_ = uVar1;
          auVar91._20_4_ = uVar1;
          auVar91._16_4_ = uVar1;
          auVar91._28_4_ = uVar1;
          auVar91._24_4_ = uVar1;
          uVar1 = local_4868[5];
          auVar87._4_4_ = uVar1;
          auVar87._0_4_ = uVar1;
          auVar87._12_4_ = uVar1;
          auVar87._8_4_ = uVar1;
          auVar87._20_4_ = uVar1;
          auVar87._16_4_ = uVar1;
          auVar87._28_4_ = uVar1;
          auVar87._24_4_ = uVar1;
          uVar1 = local_4868[6];
          auVar83._4_4_ = uVar1;
          auVar83._0_4_ = uVar1;
          auVar83._12_4_ = uVar1;
          auVar83._8_4_ = uVar1;
          auVar83._20_4_ = uVar1;
          auVar83._16_4_ = uVar1;
          auVar83._28_4_ = uVar1;
          auVar83._24_4_ = uVar1;
          uVar1 = local_4868[7];
          auVar79._4_4_ = uVar1;
          auVar79._0_4_ = uVar1;
          auVar79._12_4_ = uVar1;
          auVar79._8_4_ = uVar1;
          auVar79._20_4_ = uVar1;
          auVar79._16_4_ = uVar1;
          auVar79._28_4_ = uVar1;
          auVar79._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar107,*pauVar115,*local_4818);
          auVar12 = vfmadd213ps_fma(auVar103,pauVar115[1],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar99,pauVar115[2],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar95,pauVar115[3],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar91,pauVar115[4],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar87,pauVar115[5],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar83,pauVar115[6],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar79,pauVar115[7],ZEXT1632(auVar12));
          uVar1 = local_4868[8];
          uVar2 = local_4868[9];
          uVar3 = local_4868[10];
          uVar4 = local_4868[0xb];
          uVar5 = local_4868[0xc];
          uVar6 = local_4868[0xd];
          uVar7 = local_4868[0xe];
          uVar8 = local_4868[0xf];
          auVar108._8_8_ = CONCAT44(uVar1,uVar1);
          auVar108._0_8_ = CONCAT44(uVar1,uVar1);
          auVar108._16_8_ = CONCAT44(uVar1,uVar1);
          auVar108._24_8_ = CONCAT44(uVar1,uVar1);
          auVar13 = vfmadd213ps_fma(auVar108,*pauVar115,local_4818[1]);
          auVar104._8_8_ = CONCAT44(uVar2,uVar2);
          auVar104._0_8_ = CONCAT44(uVar2,uVar2);
          auVar104._16_8_ = CONCAT44(uVar2,uVar2);
          auVar104._24_8_ = CONCAT44(uVar2,uVar2);
          auVar13 = vfmadd213ps_fma(auVar104,pauVar115[1],ZEXT1632(auVar13));
          auVar100._8_8_ = CONCAT44(uVar3,uVar3);
          auVar100._0_8_ = CONCAT44(uVar3,uVar3);
          auVar100._16_8_ = CONCAT44(uVar3,uVar3);
          auVar100._24_8_ = CONCAT44(uVar3,uVar3);
          auVar13 = vfmadd213ps_fma(auVar100,pauVar115[2],ZEXT1632(auVar13));
          auVar96._8_8_ = CONCAT44(uVar4,uVar4);
          auVar96._0_8_ = CONCAT44(uVar4,uVar4);
          auVar96._16_8_ = CONCAT44(uVar4,uVar4);
          auVar96._24_8_ = CONCAT44(uVar4,uVar4);
          auVar13 = vfmadd213ps_fma(auVar96,pauVar115[3],ZEXT1632(auVar13));
          auVar92._8_8_ = CONCAT44(uVar5,uVar5);
          auVar92._0_8_ = CONCAT44(uVar5,uVar5);
          auVar92._16_8_ = CONCAT44(uVar5,uVar5);
          auVar92._24_8_ = CONCAT44(uVar5,uVar5);
          auVar13 = vfmadd213ps_fma(auVar92,pauVar115[4],ZEXT1632(auVar13));
          auVar88._8_8_ = CONCAT44(uVar6,uVar6);
          auVar88._0_8_ = CONCAT44(uVar6,uVar6);
          auVar88._16_8_ = CONCAT44(uVar6,uVar6);
          auVar88._24_8_ = CONCAT44(uVar6,uVar6);
          auVar13 = vfmadd213ps_fma(auVar88,pauVar115[5],ZEXT1632(auVar13));
          auVar84._8_8_ = CONCAT44(uVar7,uVar7);
          auVar84._0_8_ = CONCAT44(uVar7,uVar7);
          auVar84._16_8_ = CONCAT44(uVar7,uVar7);
          auVar84._24_8_ = CONCAT44(uVar7,uVar7);
          auVar13 = vfmadd213ps_fma(auVar84,pauVar115[6],ZEXT1632(auVar13));
          auVar80._8_8_ = CONCAT44(uVar8,uVar8);
          auVar80._0_8_ = CONCAT44(uVar8,uVar8);
          auVar80._16_8_ = CONCAT44(uVar8,uVar8);
          auVar80._24_8_ = CONCAT44(uVar8,uVar8);
          auVar13 = vfmadd213ps_fma(auVar80,pauVar115[7],ZEXT1632(auVar13));
          auVar109._8_8_ = CONCAT44(uVar1,uVar1);
          auVar109._0_8_ = CONCAT44(uVar1,uVar1);
          auVar109._16_8_ = CONCAT44(uVar1,uVar1);
          auVar109._24_8_ = CONCAT44(uVar1,uVar1);
          auVar12 = vfmadd213ps_fma(auVar109,pauVar115[8],ZEXT1632(auVar12));
          auVar105._8_8_ = CONCAT44(uVar2,uVar2);
          auVar105._0_8_ = CONCAT44(uVar2,uVar2);
          auVar105._16_8_ = CONCAT44(uVar2,uVar2);
          auVar105._24_8_ = CONCAT44(uVar2,uVar2);
          auVar12 = vfmadd213ps_fma(auVar105,pauVar115[9],ZEXT1632(auVar12));
          auVar101._8_8_ = CONCAT44(uVar3,uVar3);
          auVar101._0_8_ = CONCAT44(uVar3,uVar3);
          auVar101._16_8_ = CONCAT44(uVar3,uVar3);
          auVar101._24_8_ = CONCAT44(uVar3,uVar3);
          auVar12 = vfmadd213ps_fma(auVar101,pauVar115[10],ZEXT1632(auVar12));
          auVar97._8_8_ = CONCAT44(uVar4,uVar4);
          auVar97._0_8_ = CONCAT44(uVar4,uVar4);
          auVar97._16_8_ = CONCAT44(uVar4,uVar4);
          auVar97._24_8_ = CONCAT44(uVar4,uVar4);
          auVar12 = vfmadd213ps_fma(auVar97,pauVar115[0xb],ZEXT1632(auVar12));
          auVar93._8_8_ = CONCAT44(uVar5,uVar5);
          auVar93._0_8_ = CONCAT44(uVar5,uVar5);
          auVar93._16_8_ = CONCAT44(uVar5,uVar5);
          auVar93._24_8_ = CONCAT44(uVar5,uVar5);
          auVar12 = vfmadd213ps_fma(auVar93,pauVar115[0xc],ZEXT1632(auVar12));
          auVar89._8_8_ = CONCAT44(uVar6,uVar6);
          auVar89._0_8_ = CONCAT44(uVar6,uVar6);
          auVar89._16_8_ = CONCAT44(uVar6,uVar6);
          auVar89._24_8_ = CONCAT44(uVar6,uVar6);
          auVar12 = vfmadd213ps_fma(auVar89,pauVar115[0xd],ZEXT1632(auVar12));
          auVar85._8_8_ = CONCAT44(uVar7,uVar7);
          auVar85._0_8_ = CONCAT44(uVar7,uVar7);
          auVar85._16_8_ = CONCAT44(uVar7,uVar7);
          auVar85._24_8_ = CONCAT44(uVar7,uVar7);
          auVar12 = vfmadd213ps_fma(auVar85,pauVar115[0xe],ZEXT1632(auVar12));
          auVar81._8_8_ = CONCAT44(uVar8,uVar8);
          auVar81._0_8_ = CONCAT44(uVar8,uVar8);
          auVar81._16_8_ = CONCAT44(uVar8,uVar8);
          auVar81._24_8_ = CONCAT44(uVar8,uVar8);
          auVar12 = vfmadd213ps_fma(auVar81,pauVar115[0xf],ZEXT1632(auVar12));
          uVar1 = local_4868[0x10];
          auVar110._4_4_ = uVar1;
          auVar110._0_4_ = uVar1;
          auVar110._12_4_ = uVar1;
          auVar110._8_4_ = uVar1;
          auVar110._20_4_ = uVar1;
          auVar110._16_4_ = uVar1;
          auVar110._28_4_ = uVar1;
          auVar110._24_4_ = uVar1;
          uVar1 = local_4868[0x11];
          auVar106._4_4_ = uVar1;
          auVar106._0_4_ = uVar1;
          auVar106._12_4_ = uVar1;
          auVar106._8_4_ = uVar1;
          auVar106._20_4_ = uVar1;
          auVar106._16_4_ = uVar1;
          auVar106._28_4_ = uVar1;
          auVar106._24_4_ = uVar1;
          uVar1 = local_4868[0x12];
          auVar102._4_4_ = uVar1;
          auVar102._0_4_ = uVar1;
          auVar102._12_4_ = uVar1;
          auVar102._8_4_ = uVar1;
          auVar102._20_4_ = uVar1;
          auVar102._16_4_ = uVar1;
          auVar102._28_4_ = uVar1;
          auVar102._24_4_ = uVar1;
          uVar1 = local_4868[0x13];
          auVar98._4_4_ = uVar1;
          auVar98._0_4_ = uVar1;
          auVar98._12_4_ = uVar1;
          auVar98._8_4_ = uVar1;
          auVar98._20_4_ = uVar1;
          auVar98._16_4_ = uVar1;
          auVar98._28_4_ = uVar1;
          auVar98._24_4_ = uVar1;
          uVar1 = local_4868[0x14];
          auVar94._4_4_ = uVar1;
          auVar94._0_4_ = uVar1;
          auVar94._12_4_ = uVar1;
          auVar94._8_4_ = uVar1;
          auVar94._20_4_ = uVar1;
          auVar94._16_4_ = uVar1;
          auVar94._28_4_ = uVar1;
          auVar94._24_4_ = uVar1;
          uVar1 = local_4868[0x15];
          auVar90._4_4_ = uVar1;
          auVar90._0_4_ = uVar1;
          auVar90._12_4_ = uVar1;
          auVar90._8_4_ = uVar1;
          auVar90._20_4_ = uVar1;
          auVar90._16_4_ = uVar1;
          auVar90._28_4_ = uVar1;
          auVar90._24_4_ = uVar1;
          uVar1 = local_4868[0x16];
          auVar86._4_4_ = uVar1;
          auVar86._0_4_ = uVar1;
          auVar86._12_4_ = uVar1;
          auVar86._8_4_ = uVar1;
          auVar86._20_4_ = uVar1;
          auVar86._16_4_ = uVar1;
          auVar86._28_4_ = uVar1;
          auVar86._24_4_ = uVar1;
          uVar1 = local_4868[0x17];
          auVar82._4_4_ = uVar1;
          auVar82._0_4_ = uVar1;
          auVar82._12_4_ = uVar1;
          auVar82._8_4_ = uVar1;
          auVar82._20_4_ = uVar1;
          auVar82._16_4_ = uVar1;
          auVar82._28_4_ = uVar1;
          auVar82._24_4_ = uVar1;
          auVar13 = vfmadd213ps_fma(auVar110,pauVar115[8],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar106,pauVar115[9],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar102,pauVar115[10],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar98,pauVar115[0xb],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar94,pauVar115[0xc],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar90,pauVar115[0xd],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar86,pauVar115[0xe],ZEXT1632(auVar13));
          auVar13 = vfmadd213ps_fma(auVar82,pauVar115[0xf],ZEXT1632(auVar13));
          uVar1 = *local_4870;
          auVar75._4_4_ = uVar1;
          auVar75._0_4_ = uVar1;
          auVar75._12_4_ = uVar1;
          auVar75._8_4_ = uVar1;
          auVar75._20_4_ = uVar1;
          auVar75._16_4_ = uVar1;
          auVar75._28_4_ = uVar1;
          auVar75._24_4_ = uVar1;
          uVar1 = local_4870[1];
          auVar71._4_4_ = uVar1;
          auVar71._0_4_ = uVar1;
          auVar71._12_4_ = uVar1;
          auVar71._8_4_ = uVar1;
          auVar71._20_4_ = uVar1;
          auVar71._16_4_ = uVar1;
          auVar71._28_4_ = uVar1;
          auVar71._24_4_ = uVar1;
          uVar1 = local_4870[2];
          auVar67._4_4_ = uVar1;
          auVar67._0_4_ = uVar1;
          auVar67._12_4_ = uVar1;
          auVar67._8_4_ = uVar1;
          auVar67._20_4_ = uVar1;
          auVar67._16_4_ = uVar1;
          auVar67._28_4_ = uVar1;
          auVar67._24_4_ = uVar1;
          uVar1 = local_4870[3];
          auVar63._4_4_ = uVar1;
          auVar63._0_4_ = uVar1;
          auVar63._12_4_ = uVar1;
          auVar63._8_4_ = uVar1;
          auVar63._20_4_ = uVar1;
          auVar63._16_4_ = uVar1;
          auVar63._28_4_ = uVar1;
          auVar63._24_4_ = uVar1;
          uVar1 = local_4870[4];
          auVar59._4_4_ = uVar1;
          auVar59._0_4_ = uVar1;
          auVar59._12_4_ = uVar1;
          auVar59._8_4_ = uVar1;
          auVar59._20_4_ = uVar1;
          auVar59._16_4_ = uVar1;
          auVar59._28_4_ = uVar1;
          auVar59._24_4_ = uVar1;
          uVar1 = local_4870[5];
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._20_4_ = uVar1;
          auVar55._16_4_ = uVar1;
          auVar55._28_4_ = uVar1;
          auVar55._24_4_ = uVar1;
          uVar1 = local_4870[6];
          auVar51._4_4_ = uVar1;
          auVar51._0_4_ = uVar1;
          auVar51._12_4_ = uVar1;
          auVar51._8_4_ = uVar1;
          auVar51._20_4_ = uVar1;
          auVar51._16_4_ = uVar1;
          auVar51._28_4_ = uVar1;
          auVar51._24_4_ = uVar1;
          uVar1 = local_4870[7];
          auVar47._4_4_ = uVar1;
          auVar47._0_4_ = uVar1;
          auVar47._12_4_ = uVar1;
          auVar47._8_4_ = uVar1;
          auVar47._20_4_ = uVar1;
          auVar47._16_4_ = uVar1;
          auVar47._28_4_ = uVar1;
          auVar47._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar75,pauVar115[0x10],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar71,pauVar115[0x11],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar67,pauVar115[0x12],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar63,pauVar115[0x13],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar59,pauVar115[0x14],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar55,pauVar115[0x15],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar51,pauVar115[0x16],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar47,pauVar115[0x17],ZEXT1632(auVar12));
          uVar1 = local_4870[8];
          uVar2 = local_4870[9];
          uVar3 = local_4870[10];
          uVar4 = local_4870[0xb];
          uVar5 = local_4870[0xc];
          uVar6 = local_4870[0xd];
          uVar7 = local_4870[0xe];
          uVar8 = local_4870[0xf];
          auVar76._8_8_ = CONCAT44(uVar1,uVar1);
          auVar76._0_8_ = CONCAT44(uVar1,uVar1);
          auVar76._16_8_ = CONCAT44(uVar1,uVar1);
          auVar76._24_8_ = CONCAT44(uVar1,uVar1);
          auVar13 = vfmadd213ps_fma(auVar76,pauVar115[0x10],ZEXT1632(auVar13));
          auVar72._8_8_ = CONCAT44(uVar2,uVar2);
          auVar72._0_8_ = CONCAT44(uVar2,uVar2);
          auVar72._16_8_ = CONCAT44(uVar2,uVar2);
          auVar72._24_8_ = CONCAT44(uVar2,uVar2);
          auVar13 = vfmadd213ps_fma(auVar72,pauVar115[0x11],ZEXT1632(auVar13));
          auVar68._8_8_ = CONCAT44(uVar3,uVar3);
          auVar68._0_8_ = CONCAT44(uVar3,uVar3);
          auVar68._16_8_ = CONCAT44(uVar3,uVar3);
          auVar68._24_8_ = CONCAT44(uVar3,uVar3);
          auVar13 = vfmadd213ps_fma(auVar68,pauVar115[0x12],ZEXT1632(auVar13));
          auVar64._8_8_ = CONCAT44(uVar4,uVar4);
          auVar64._0_8_ = CONCAT44(uVar4,uVar4);
          auVar64._16_8_ = CONCAT44(uVar4,uVar4);
          auVar64._24_8_ = CONCAT44(uVar4,uVar4);
          auVar13 = vfmadd213ps_fma(auVar64,pauVar115[0x13],ZEXT1632(auVar13));
          auVar60._8_8_ = CONCAT44(uVar5,uVar5);
          auVar60._0_8_ = CONCAT44(uVar5,uVar5);
          auVar60._16_8_ = CONCAT44(uVar5,uVar5);
          auVar60._24_8_ = CONCAT44(uVar5,uVar5);
          auVar13 = vfmadd213ps_fma(auVar60,pauVar115[0x14],ZEXT1632(auVar13));
          auVar56._8_8_ = CONCAT44(uVar6,uVar6);
          auVar56._0_8_ = CONCAT44(uVar6,uVar6);
          auVar56._16_8_ = CONCAT44(uVar6,uVar6);
          auVar56._24_8_ = CONCAT44(uVar6,uVar6);
          auVar13 = vfmadd213ps_fma(auVar56,pauVar115[0x15],ZEXT1632(auVar13));
          auVar52._8_8_ = CONCAT44(uVar7,uVar7);
          auVar52._0_8_ = CONCAT44(uVar7,uVar7);
          auVar52._16_8_ = CONCAT44(uVar7,uVar7);
          auVar52._24_8_ = CONCAT44(uVar7,uVar7);
          auVar13 = vfmadd213ps_fma(auVar52,pauVar115[0x16],ZEXT1632(auVar13));
          auVar48._8_8_ = CONCAT44(uVar8,uVar8);
          auVar48._0_8_ = CONCAT44(uVar8,uVar8);
          auVar48._16_8_ = CONCAT44(uVar8,uVar8);
          auVar48._24_8_ = CONCAT44(uVar8,uVar8);
          auVar13 = vfmadd213ps_fma(auVar48,pauVar115[0x17],ZEXT1632(auVar13));
          auVar77._8_8_ = CONCAT44(uVar1,uVar1);
          auVar77._0_8_ = CONCAT44(uVar1,uVar1);
          auVar77._16_8_ = CONCAT44(uVar1,uVar1);
          auVar77._24_8_ = CONCAT44(uVar1,uVar1);
          auVar12 = vfmadd213ps_fma(auVar77,pauVar115[0x18],ZEXT1632(auVar12));
          auVar73._8_8_ = CONCAT44(uVar2,uVar2);
          auVar73._0_8_ = CONCAT44(uVar2,uVar2);
          auVar73._16_8_ = CONCAT44(uVar2,uVar2);
          auVar73._24_8_ = CONCAT44(uVar2,uVar2);
          auVar12 = vfmadd213ps_fma(auVar73,pauVar115[0x19],ZEXT1632(auVar12));
          auVar69._8_8_ = CONCAT44(uVar3,uVar3);
          auVar69._0_8_ = CONCAT44(uVar3,uVar3);
          auVar69._16_8_ = CONCAT44(uVar3,uVar3);
          auVar69._24_8_ = CONCAT44(uVar3,uVar3);
          auVar12 = vfmadd213ps_fma(auVar69,pauVar115[0x1a],ZEXT1632(auVar12));
          auVar65._8_8_ = CONCAT44(uVar4,uVar4);
          auVar65._0_8_ = CONCAT44(uVar4,uVar4);
          auVar65._16_8_ = CONCAT44(uVar4,uVar4);
          auVar65._24_8_ = CONCAT44(uVar4,uVar4);
          auVar12 = vfmadd213ps_fma(auVar65,pauVar115[0x1b],ZEXT1632(auVar12));
          auVar61._8_8_ = CONCAT44(uVar5,uVar5);
          auVar61._0_8_ = CONCAT44(uVar5,uVar5);
          auVar61._16_8_ = CONCAT44(uVar5,uVar5);
          auVar61._24_8_ = CONCAT44(uVar5,uVar5);
          auVar12 = vfmadd213ps_fma(auVar61,pauVar115[0x1c],ZEXT1632(auVar12));
          auVar57._8_8_ = CONCAT44(uVar6,uVar6);
          auVar57._0_8_ = CONCAT44(uVar6,uVar6);
          auVar57._16_8_ = CONCAT44(uVar6,uVar6);
          auVar57._24_8_ = CONCAT44(uVar6,uVar6);
          auVar12 = vfmadd213ps_fma(auVar57,pauVar115[0x1d],ZEXT1632(auVar12));
          auVar53._8_8_ = CONCAT44(uVar7,uVar7);
          auVar53._0_8_ = CONCAT44(uVar7,uVar7);
          auVar53._16_8_ = CONCAT44(uVar7,uVar7);
          auVar53._24_8_ = CONCAT44(uVar7,uVar7);
          auVar12 = vfmadd213ps_fma(auVar53,pauVar115[0x1e],ZEXT1632(auVar12));
          auVar49._8_8_ = CONCAT44(uVar8,uVar8);
          auVar49._0_8_ = CONCAT44(uVar8,uVar8);
          auVar49._16_8_ = CONCAT44(uVar8,uVar8);
          auVar49._24_8_ = CONCAT44(uVar8,uVar8);
          auVar12 = vfmadd213ps_fma(auVar49,pauVar115[0x1f],ZEXT1632(auVar12));
          local_5900 = auVar12._0_8_;
          uStack_58f8 = auVar12._8_8_;
          uVar1 = local_4870[0x10];
          auVar78._4_4_ = uVar1;
          auVar78._0_4_ = uVar1;
          auVar78._12_4_ = uVar1;
          auVar78._8_4_ = uVar1;
          auVar78._20_4_ = uVar1;
          auVar78._16_4_ = uVar1;
          auVar78._28_4_ = uVar1;
          auVar78._24_4_ = uVar1;
          uVar1 = local_4870[0x11];
          auVar74._4_4_ = uVar1;
          auVar74._0_4_ = uVar1;
          auVar74._12_4_ = uVar1;
          auVar74._8_4_ = uVar1;
          auVar74._20_4_ = uVar1;
          auVar74._16_4_ = uVar1;
          auVar74._28_4_ = uVar1;
          auVar74._24_4_ = uVar1;
          uVar1 = local_4870[0x12];
          auVar70._4_4_ = uVar1;
          auVar70._0_4_ = uVar1;
          auVar70._12_4_ = uVar1;
          auVar70._8_4_ = uVar1;
          auVar70._20_4_ = uVar1;
          auVar70._16_4_ = uVar1;
          auVar70._28_4_ = uVar1;
          auVar70._24_4_ = uVar1;
          uVar1 = local_4870[0x13];
          auVar66._4_4_ = uVar1;
          auVar66._0_4_ = uVar1;
          auVar66._12_4_ = uVar1;
          auVar66._8_4_ = uVar1;
          auVar66._20_4_ = uVar1;
          auVar66._16_4_ = uVar1;
          auVar66._28_4_ = uVar1;
          auVar66._24_4_ = uVar1;
          uVar1 = local_4870[0x14];
          auVar62._4_4_ = uVar1;
          auVar62._0_4_ = uVar1;
          auVar62._12_4_ = uVar1;
          auVar62._8_4_ = uVar1;
          auVar62._20_4_ = uVar1;
          auVar62._16_4_ = uVar1;
          auVar62._28_4_ = uVar1;
          auVar62._24_4_ = uVar1;
          uVar1 = local_4870[0x15];
          auVar58._4_4_ = uVar1;
          auVar58._0_4_ = uVar1;
          auVar58._12_4_ = uVar1;
          auVar58._8_4_ = uVar1;
          auVar58._20_4_ = uVar1;
          auVar58._16_4_ = uVar1;
          auVar58._28_4_ = uVar1;
          auVar58._24_4_ = uVar1;
          uVar1 = local_4870[0x16];
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._20_4_ = uVar1;
          auVar54._16_4_ = uVar1;
          auVar54._28_4_ = uVar1;
          auVar54._24_4_ = uVar1;
          uVar1 = local_4870[0x17];
          auVar50._4_4_ = uVar1;
          auVar50._0_4_ = uVar1;
          auVar50._12_4_ = uVar1;
          auVar50._8_4_ = uVar1;
          auVar50._20_4_ = uVar1;
          auVar50._16_4_ = uVar1;
          auVar50._28_4_ = uVar1;
          auVar50._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar78,pauVar115[0x18],ZEXT1632(auVar13));
          auVar12 = vfmadd213ps_fma(auVar74,pauVar115[0x19],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar70,pauVar115[0x1a],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar66,pauVar115[0x1b],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar62,pauVar115[0x1c],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar58,pauVar115[0x1d],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar54,pauVar115[0x1e],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar50,pauVar115[0x1f],ZEXT1632(auVar12));
          *(undefined8 *)*local_4818 = local_5900;
          *(undefined8 *)(*local_4818 + 8) = uStack_58f8;
          *(undefined8 *)(*local_4818 + 0x10) = 0;
          *(undefined8 *)(*local_4818 + 0x18) = 0;
          local_4818[1] = ZEXT1632(auVar12);
          local_4818 = local_4818 + 2;
          local_4870 = local_4870 + 0x10;
          local_4868 = local_4868 + 0x10;
        }
        for (; local_48c8 < iVar9; local_48c8 = local_48c8 + 1) {
          uVar1 = *local_4868;
          auVar45._4_4_ = uVar1;
          auVar45._0_4_ = uVar1;
          auVar45._12_4_ = uVar1;
          auVar45._8_4_ = uVar1;
          auVar45._20_4_ = uVar1;
          auVar45._16_4_ = uVar1;
          auVar45._28_4_ = uVar1;
          auVar45._24_4_ = uVar1;
          uVar1 = local_4868[1];
          auVar43._4_4_ = uVar1;
          auVar43._0_4_ = uVar1;
          auVar43._12_4_ = uVar1;
          auVar43._8_4_ = uVar1;
          auVar43._20_4_ = uVar1;
          auVar43._16_4_ = uVar1;
          auVar43._28_4_ = uVar1;
          auVar43._24_4_ = uVar1;
          uVar1 = local_4868[2];
          auVar41._4_4_ = uVar1;
          auVar41._0_4_ = uVar1;
          auVar41._12_4_ = uVar1;
          auVar41._8_4_ = uVar1;
          auVar41._20_4_ = uVar1;
          auVar41._16_4_ = uVar1;
          auVar41._28_4_ = uVar1;
          auVar41._24_4_ = uVar1;
          uVar1 = local_4868[3];
          auVar39._4_4_ = uVar1;
          auVar39._0_4_ = uVar1;
          auVar39._12_4_ = uVar1;
          auVar39._8_4_ = uVar1;
          auVar39._20_4_ = uVar1;
          auVar39._16_4_ = uVar1;
          auVar39._28_4_ = uVar1;
          auVar39._24_4_ = uVar1;
          uVar1 = local_4868[4];
          auVar37._4_4_ = uVar1;
          auVar37._0_4_ = uVar1;
          auVar37._12_4_ = uVar1;
          auVar37._8_4_ = uVar1;
          auVar37._20_4_ = uVar1;
          auVar37._16_4_ = uVar1;
          auVar37._28_4_ = uVar1;
          auVar37._24_4_ = uVar1;
          uVar1 = local_4868[5];
          auVar35._4_4_ = uVar1;
          auVar35._0_4_ = uVar1;
          auVar35._12_4_ = uVar1;
          auVar35._8_4_ = uVar1;
          auVar35._20_4_ = uVar1;
          auVar35._16_4_ = uVar1;
          auVar35._28_4_ = uVar1;
          auVar35._24_4_ = uVar1;
          uVar1 = local_4868[6];
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._20_4_ = uVar1;
          auVar33._16_4_ = uVar1;
          auVar33._28_4_ = uVar1;
          auVar33._24_4_ = uVar1;
          uVar1 = local_4868[7];
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._20_4_ = uVar1;
          auVar31._16_4_ = uVar1;
          auVar31._28_4_ = uVar1;
          auVar31._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar45,*pauVar115,*local_4818);
          auVar12 = vfmadd213ps_fma(auVar43,pauVar115[1],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar41,pauVar115[2],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar39,pauVar115[3],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar37,pauVar115[4],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar35,pauVar115[5],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar33,pauVar115[6],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar31,pauVar115[7],ZEXT1632(auVar12));
          uVar1 = local_4868[8];
          auVar46._4_4_ = uVar1;
          auVar46._0_4_ = uVar1;
          auVar46._12_4_ = uVar1;
          auVar46._8_4_ = uVar1;
          auVar46._20_4_ = uVar1;
          auVar46._16_4_ = uVar1;
          auVar46._28_4_ = uVar1;
          auVar46._24_4_ = uVar1;
          uVar1 = local_4868[9];
          auVar44._4_4_ = uVar1;
          auVar44._0_4_ = uVar1;
          auVar44._12_4_ = uVar1;
          auVar44._8_4_ = uVar1;
          auVar44._20_4_ = uVar1;
          auVar44._16_4_ = uVar1;
          auVar44._28_4_ = uVar1;
          auVar44._24_4_ = uVar1;
          uVar1 = local_4868[10];
          auVar42._4_4_ = uVar1;
          auVar42._0_4_ = uVar1;
          auVar42._12_4_ = uVar1;
          auVar42._8_4_ = uVar1;
          auVar42._20_4_ = uVar1;
          auVar42._16_4_ = uVar1;
          auVar42._28_4_ = uVar1;
          auVar42._24_4_ = uVar1;
          uVar1 = local_4868[0xb];
          auVar40._4_4_ = uVar1;
          auVar40._0_4_ = uVar1;
          auVar40._12_4_ = uVar1;
          auVar40._8_4_ = uVar1;
          auVar40._20_4_ = uVar1;
          auVar40._16_4_ = uVar1;
          auVar40._28_4_ = uVar1;
          auVar40._24_4_ = uVar1;
          uVar1 = local_4868[0xc];
          auVar38._4_4_ = uVar1;
          auVar38._0_4_ = uVar1;
          auVar38._12_4_ = uVar1;
          auVar38._8_4_ = uVar1;
          auVar38._20_4_ = uVar1;
          auVar38._16_4_ = uVar1;
          auVar38._28_4_ = uVar1;
          auVar38._24_4_ = uVar1;
          uVar1 = local_4868[0xd];
          auVar36._4_4_ = uVar1;
          auVar36._0_4_ = uVar1;
          auVar36._12_4_ = uVar1;
          auVar36._8_4_ = uVar1;
          auVar36._20_4_ = uVar1;
          auVar36._16_4_ = uVar1;
          auVar36._28_4_ = uVar1;
          auVar36._24_4_ = uVar1;
          uVar1 = local_4868[0xe];
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._20_4_ = uVar1;
          auVar34._16_4_ = uVar1;
          auVar34._28_4_ = uVar1;
          auVar34._24_4_ = uVar1;
          uVar1 = local_4868[0xf];
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._20_4_ = uVar1;
          auVar32._16_4_ = uVar1;
          auVar32._28_4_ = uVar1;
          auVar32._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar46,pauVar115[8],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar44,pauVar115[9],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar42,pauVar115[10],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar40,pauVar115[0xb],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar38,pauVar115[0xc],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar36,pauVar115[0xd],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar34,pauVar115[0xe],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar32,pauVar115[0xf],ZEXT1632(auVar12));
          uVar1 = *local_4870;
          auVar29._4_4_ = uVar1;
          auVar29._0_4_ = uVar1;
          auVar29._12_4_ = uVar1;
          auVar29._8_4_ = uVar1;
          auVar29._20_4_ = uVar1;
          auVar29._16_4_ = uVar1;
          auVar29._28_4_ = uVar1;
          auVar29._24_4_ = uVar1;
          uVar1 = local_4870[1];
          auVar27._4_4_ = uVar1;
          auVar27._0_4_ = uVar1;
          auVar27._12_4_ = uVar1;
          auVar27._8_4_ = uVar1;
          auVar27._20_4_ = uVar1;
          auVar27._16_4_ = uVar1;
          auVar27._28_4_ = uVar1;
          auVar27._24_4_ = uVar1;
          uVar1 = local_4870[2];
          auVar25._4_4_ = uVar1;
          auVar25._0_4_ = uVar1;
          auVar25._12_4_ = uVar1;
          auVar25._8_4_ = uVar1;
          auVar25._20_4_ = uVar1;
          auVar25._16_4_ = uVar1;
          auVar25._28_4_ = uVar1;
          auVar25._24_4_ = uVar1;
          uVar1 = local_4870[3];
          auVar23._4_4_ = uVar1;
          auVar23._0_4_ = uVar1;
          auVar23._12_4_ = uVar1;
          auVar23._8_4_ = uVar1;
          auVar23._20_4_ = uVar1;
          auVar23._16_4_ = uVar1;
          auVar23._28_4_ = uVar1;
          auVar23._24_4_ = uVar1;
          uVar1 = local_4870[4];
          auVar21._4_4_ = uVar1;
          auVar21._0_4_ = uVar1;
          auVar21._12_4_ = uVar1;
          auVar21._8_4_ = uVar1;
          auVar21._20_4_ = uVar1;
          auVar21._16_4_ = uVar1;
          auVar21._28_4_ = uVar1;
          auVar21._24_4_ = uVar1;
          uVar1 = local_4870[5];
          auVar19._4_4_ = uVar1;
          auVar19._0_4_ = uVar1;
          auVar19._12_4_ = uVar1;
          auVar19._8_4_ = uVar1;
          auVar19._20_4_ = uVar1;
          auVar19._16_4_ = uVar1;
          auVar19._28_4_ = uVar1;
          auVar19._24_4_ = uVar1;
          uVar1 = local_4870[6];
          auVar17._4_4_ = uVar1;
          auVar17._0_4_ = uVar1;
          auVar17._12_4_ = uVar1;
          auVar17._8_4_ = uVar1;
          auVar17._20_4_ = uVar1;
          auVar17._16_4_ = uVar1;
          auVar17._28_4_ = uVar1;
          auVar17._24_4_ = uVar1;
          uVar1 = local_4870[7];
          auVar15._4_4_ = uVar1;
          auVar15._0_4_ = uVar1;
          auVar15._12_4_ = uVar1;
          auVar15._8_4_ = uVar1;
          auVar15._20_4_ = uVar1;
          auVar15._16_4_ = uVar1;
          auVar15._28_4_ = uVar1;
          auVar15._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar29,pauVar115[0x10],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar27,pauVar115[0x11],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar25,pauVar115[0x12],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar23,pauVar115[0x13],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar21,pauVar115[0x14],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar19,pauVar115[0x15],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar17,pauVar115[0x16],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar15,pauVar115[0x17],ZEXT1632(auVar12));
          uVar1 = local_4870[8];
          auVar30._4_4_ = uVar1;
          auVar30._0_4_ = uVar1;
          auVar30._12_4_ = uVar1;
          auVar30._8_4_ = uVar1;
          auVar30._20_4_ = uVar1;
          auVar30._16_4_ = uVar1;
          auVar30._28_4_ = uVar1;
          auVar30._24_4_ = uVar1;
          uVar1 = local_4870[9];
          auVar28._4_4_ = uVar1;
          auVar28._0_4_ = uVar1;
          auVar28._12_4_ = uVar1;
          auVar28._8_4_ = uVar1;
          auVar28._20_4_ = uVar1;
          auVar28._16_4_ = uVar1;
          auVar28._28_4_ = uVar1;
          auVar28._24_4_ = uVar1;
          uVar1 = local_4870[10];
          auVar26._4_4_ = uVar1;
          auVar26._0_4_ = uVar1;
          auVar26._12_4_ = uVar1;
          auVar26._8_4_ = uVar1;
          auVar26._20_4_ = uVar1;
          auVar26._16_4_ = uVar1;
          auVar26._28_4_ = uVar1;
          auVar26._24_4_ = uVar1;
          uVar1 = local_4870[0xb];
          auVar24._4_4_ = uVar1;
          auVar24._0_4_ = uVar1;
          auVar24._12_4_ = uVar1;
          auVar24._8_4_ = uVar1;
          auVar24._20_4_ = uVar1;
          auVar24._16_4_ = uVar1;
          auVar24._28_4_ = uVar1;
          auVar24._24_4_ = uVar1;
          uVar1 = local_4870[0xc];
          auVar22._4_4_ = uVar1;
          auVar22._0_4_ = uVar1;
          auVar22._12_4_ = uVar1;
          auVar22._8_4_ = uVar1;
          auVar22._20_4_ = uVar1;
          auVar22._16_4_ = uVar1;
          auVar22._28_4_ = uVar1;
          auVar22._24_4_ = uVar1;
          uVar1 = local_4870[0xd];
          auVar20._4_4_ = uVar1;
          auVar20._0_4_ = uVar1;
          auVar20._12_4_ = uVar1;
          auVar20._8_4_ = uVar1;
          auVar20._20_4_ = uVar1;
          auVar20._16_4_ = uVar1;
          auVar20._28_4_ = uVar1;
          auVar20._24_4_ = uVar1;
          uVar1 = local_4870[0xe];
          auVar18._4_4_ = uVar1;
          auVar18._0_4_ = uVar1;
          auVar18._12_4_ = uVar1;
          auVar18._8_4_ = uVar1;
          auVar18._20_4_ = uVar1;
          auVar18._16_4_ = uVar1;
          auVar18._28_4_ = uVar1;
          auVar18._24_4_ = uVar1;
          uVar1 = local_4870[0xf];
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar16._20_4_ = uVar1;
          auVar16._16_4_ = uVar1;
          auVar16._28_4_ = uVar1;
          auVar16._24_4_ = uVar1;
          auVar12 = vfmadd213ps_fma(auVar30,pauVar115[0x18],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar28,pauVar115[0x19],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar26,pauVar115[0x1a],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar24,pauVar115[0x1b],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar22,pauVar115[0x1c],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar20,pauVar115[0x1d],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar18,pauVar115[0x1e],ZEXT1632(auVar12));
          auVar12 = vfmadd213ps_fma(auVar16,pauVar115[0x1f],ZEXT1632(auVar12));
          *local_4818 = ZEXT1632(auVar12);
          local_4818 = local_4818 + 1;
          local_4870 = local_4870 + 8;
          local_4868 = local_4868 + 8;
        }
        local_4868 = local_4868 + 8;
        local_4870 = local_4870 + 8;
      }
    }
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}